

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O2

optional<helics::ActionMessage> * __thiscall
helics::ipc::OwnedQueue::getMessage
          (optional<helics::ActionMessage> *__return_storage_ptr__,OwnedQueue *this,int timeout)

{
  action_t aVar1;
  bool bVar2;
  ostream *poVar3;
  size_t rx_size;
  uint priority;
  ActionMessage cmd;
  time_duration_type local_100;
  size_type local_f8;
  uint local_ec;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_e8;
  
  if (this->connected == false) {
    (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload.
    super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
    super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
  }
  else {
    local_f8 = 0;
    local_ec = 0;
    do {
      do {
        if (timeout < 0) {
          bVar2 = boost::interprocess::
                  message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>
                  ::try_receive((this->rqueue)._M_t.
                                super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                                .
                                super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
                                ._M_head_impl,
                                (this->buffer).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(long)this->mxSize,
                                &local_f8,&local_ec);
        }
        else {
          local_e8.time_.time_count_.value_ =
               (time_rep_type)
               boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time();
          local_100.
          super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
          .ticks_.value_ =
               (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                )(time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                  )((ulong)(uint)timeout * 1000);
          boost::date_time::
          base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
          ::operator+=(&local_e8,&local_100);
          bVar2 = boost::interprocess::
                  message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>
                  ::timed_receive((this->rqueue)._M_t.
                                  super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                                  .
                                  super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
                                  ._M_head_impl,
                                  (this->buffer).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,(long)this->mxSize,
                                  &local_f8,&local_ec,(ptime *)&local_e8);
        }
        if (bVar2 == false) {
          (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>).
          _M_payload.super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
          super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
          return __return_storage_ptr__;
        }
      } while (local_f8 < 8);
      ActionMessage::ActionMessage
                ((ActionMessage *)&local_e8,
                 (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,local_f8);
      aVar1 = (action_t)local_e8.time_.time_count_.value_;
      if ((action_t)local_e8.time_.time_count_.value_ == cmd_invalid) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"invalid command received ipc");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        std::optional<helics::ActionMessage>::optional<helics::ActionMessage,_true>
                  (__return_storage_ptr__,(ActionMessage *)&local_e8);
      }
      ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
    } while (aVar1 == cmd_invalid);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<ActionMessage> OwnedQueue::getMessage(int timeout)
    {
        if (!connected) {
            return std::nullopt;
        }
        size_t rx_size = 0;
        unsigned int priority{0};
        while (true) {
            if (timeout >= 0) {
                timetype abs_time = clocktype::universal_time();
                abs_time += boost::posix_time::milliseconds(timeout);
                bool res =
                    rqueue->timed_receive(buffer.data(), mxSize, rx_size, priority, abs_time);
                if (!res) {
                    return std::nullopt;
                }
            } else if (timeout <= 0) {
                bool res = rqueue->try_receive(buffer.data(), mxSize, rx_size, priority);
                if (!res) {
                    return std::nullopt;
                }
            }

            if (rx_size < 8) {
                continue;
            }
            ActionMessage cmd(reinterpret_cast<std::byte*>(buffer.data()), rx_size);
            if (!isValidCommand(cmd)) {
                std::cerr << "invalid command received ipc" << std::endl;
                continue;
            }
            return cmd;
        }
    }